

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transition.cc
# Opt level: O2

void __thiscall transition_invoke_action_e_Test::TestBody(transition_invoke_action_e_Test *this)

{
  return;
}

Assistant:

TEST(transition, invoke_action_e) {
    auto transition = make_transition(
        state<s1>, event<e1>, _, [](e1&) { return s2{}; }, state<s2>);

    auto s = s1{};
    auto e = e1{};

    static_assert(std::is_same<decltype(transition.action(e)), s2>::value, "");
    static_assert(std::is_same<decltype(transition.invoke_action(s, e)), s2>::value, "");
}